

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceObjectArchive.cpp
# Opt level: O0

SerializedData * __thiscall
Diligent::DeviceObjectArchive::GetDeviceSpecificData
          (DeviceObjectArchive *this,ResourceType Type,char *Name,DeviceType DevType)

{
  undefined *puVar1;
  char *Str0;
  bool bVar2;
  int iVar3;
  undefined8 uVar4;
  pointer pvVar5;
  char *Str1;
  Char *Message;
  char (*Args_1) [40];
  char (*in_R8) [32];
  undefined1 local_98 [8];
  string msg;
  string _msg;
  NamedResourceKey local_50;
  _Node_iterator_base<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_false>
  local_38;
  const_iterator it;
  char *pcStack_28;
  DeviceType DevType_local;
  char *Name_local;
  DeviceObjectArchive *pDStack_18;
  ResourceType Type_local;
  DeviceObjectArchive *this_local;
  
  Args_1 = (char (*) [40])0x0;
  it.
  super__Node_iterator_base<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_false>
  ._M_cur._4_4_ = DevType;
  pcStack_28 = Name;
  Name_local._4_4_ = Type;
  pDStack_18 = this;
  NamedResourceKey::NamedResourceKey(&local_50,Type,Name,false);
  local_38._M_cur =
       (__node_type *)
       std::
       unordered_map<Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData,_Diligent::DeviceObjectArchive::NamedResourceKey::Hasher,_std::equal_to<Diligent::DeviceObjectArchive::NamedResourceKey>,_std::allocator<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>_>
       ::find(&this->m_NamedResources,&local_50);
  NamedResourceKey::~NamedResourceKey(&local_50);
  _msg.field_2._8_8_ =
       std::
       unordered_map<Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData,_Diligent::DeviceObjectArchive::NamedResourceKey::Hasher,_std::equal_to<Diligent::DeviceObjectArchive::NamedResourceKey>,_std::allocator<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>_>_>
       ::end(&this->m_NamedResources);
  bVar2 = std::__detail::operator==
                    (&local_38,
                     (_Node_iterator_base<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_false>
                      *)((long)&_msg.field_2 + 8));
  Str0 = pcStack_28;
  if (bVar2) {
    FormatString<char[11],char_const*,char[32]>
              ((string *)((long)&msg.field_2 + 8),(Diligent *)"Resource \'",
               (char (*) [11])&stack0xffffffffffffffd8,(char **)"\' is not present in the archive",
               in_R8);
    puVar1 = DebugMessageCallback;
    if (DebugMessageCallback != (undefined *)0x0) {
      uVar4 = std::__cxx11::string::c_str();
      (*(code *)puVar1)(2,uVar4,0);
    }
    std::__cxx11::string::~string((string *)(msg.field_2._M_local_buf + 8));
    if (GetDeviceSpecificData(Diligent::DeviceObjectArchive::ResourceType,char_const*,Diligent::DeviceObjectArchive::DeviceType)
        ::NullData == '\0') {
      iVar3 = __cxa_guard_acquire(&GetDeviceSpecificData(Diligent::DeviceObjectArchive::ResourceType,char_const*,Diligent::DeviceObjectArchive::DeviceType)
                                   ::NullData);
      if (iVar3 != 0) {
        SerializedData::SerializedData(&GetDeviceSpecificData::NullData);
        __cxa_atexit(SerializedData::~SerializedData,&GetDeviceSpecificData::NullData,&__dso_handle)
        ;
        __cxa_guard_release(&GetDeviceSpecificData(Diligent::DeviceObjectArchive::ResourceType,char_const*,Diligent::DeviceObjectArchive::DeviceType)
                             ::NullData);
      }
    }
    this_local = (DeviceObjectArchive *)&GetDeviceSpecificData::NullData;
  }
  else {
    pvVar5 = std::__detail::
             _Node_const_iterator<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_false,_false>
             ::operator->((_Node_const_iterator<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_false,_false>
                           *)&local_38);
    Str1 = NamedResourceKey::GetName(&pvVar5->first);
    bVar2 = SafeStrEqual(Str0,Str1);
    if (!bVar2) {
      FormatString<char[26],char[40]>
                ((string *)local_98,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"SafeStrEqual(Name, it->first.GetName())",Args_1);
      Message = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (Message,"GetDeviceSpecificData",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceObjectArchive.cpp"
                 ,0x16a);
      std::__cxx11::string::~string((string *)local_98);
    }
    pvVar5 = std::__detail::
             _Node_const_iterator<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_false,_false>
             ::operator->((_Node_const_iterator<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_false,_false>
                           *)&local_38);
    this_local = (DeviceObjectArchive *)
                 std::array<Diligent::SerializedData,_7UL>::operator[]
                           (&(pvVar5->second).DeviceSpecific,
                            (ulong)it.
                                   super__Node_iterator_base<std::pair<const_Diligent::DeviceObjectArchive::NamedResourceKey,_Diligent::DeviceObjectArchive::ResourceData>,_false>
                                   ._M_cur._4_4_);
  }
  return (SerializedData *)this_local;
}

Assistant:

const SerializedData& DeviceObjectArchive::GetDeviceSpecificData(ResourceType Type,
                                                                 const char*  Name,
                                                                 DeviceType   DevType) const noexcept
{
    auto it = m_NamedResources.find(NamedResourceKey{Type, Name});
    if (it == m_NamedResources.end())
    {
        LOG_ERROR_MESSAGE("Resource '", Name, "' is not present in the archive");
        static const SerializedData NullData;
        return NullData;
    }
    VERIFY_EXPR(SafeStrEqual(Name, it->first.GetName()));
    return it->second.DeviceSpecific[static_cast<size_t>(DevType)];
}